

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  uint uVar1;
  stbi_uc *psVar2;
  sbyte sVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  uint uVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  byte bVar10;
  ushort uVar11;
  ushort uVar12;
  uint uVar13;
  long lVar14;
  int iVar15;
  byte *pbVar16;
  uint uVar17;
  int iVar18;
  stbi_uc sVar19;
  ulong uVar20;
  stbi_uc *psVar21;
  long lVar22;
  char *pcVar23;
  stbi__uint32 sVar24;
  stbi__uint32 sVar25;
  uint uVar26;
  ulong uVar27;
  undefined1 auVar28 [16];
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  ushort auStack_2026e [32623];
  byte abStack_1038f [63879];
  undefined1 local_a08 [15];
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0015e4d0:
    a->num_bits = 0;
    a->code_buffer = 0;
    iVar15 = 0;
    do {
      if (iVar15 < 1) {
        stbi__fill_bits(a);
        iVar15 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar24 = uVar1 >> 1;
      iVar7 = iVar15 + -1;
      a->code_buffer = sVar24;
      a->num_bits = iVar7;
      if (iVar15 < 3) {
        stbi__fill_bits(a);
        iVar7 = a->num_bits;
        sVar24 = a->code_buffer;
      }
      sVar25 = sVar24 >> 2;
      uVar6 = iVar7 - 2;
      a->code_buffer = sVar25;
      a->num_bits = uVar6;
      switch(sVar24 & 3) {
      case 0:
        uVar17 = uVar6 & 7;
        if (uVar17 != 0) {
          if (iVar7 < 2) {
            stbi__fill_bits(a);
            uVar6 = a->num_bits;
            sVar25 = a->code_buffer;
          }
          sVar25 = sVar25 >> uVar17;
          uVar6 = uVar6 - uVar17;
          a->code_buffer = sVar25;
          a->num_bits = uVar6;
        }
        if ((int)uVar6 < 1) {
          if (uVar6 != 0) goto LAB_0015ed47;
          uVar27 = 0;
LAB_0015ec13:
          psVar21 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          do {
            if (psVar21 < psVar2) {
              a->zbuffer = psVar21 + 1;
              sVar19 = *psVar21;
              psVar21 = psVar21 + 1;
            }
            else {
              sVar19 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar27) = sVar19;
            uVar27 = uVar27 + 1;
          } while (uVar27 != 4);
        }
        else {
          uVar20 = 0xffffffffffffffff;
          uVar17 = uVar6 - 1 >> 3;
          uVar27 = (ulong)(uVar17 + 1);
          do {
            *(char *)((long)local_814.fast + uVar20 + 1) = (char)sVar25;
            sVar25 = sVar25 >> 8;
            uVar20 = uVar20 + 1;
          } while (uVar17 != uVar20);
          a->code_buffer = sVar25;
          iVar15 = (uVar6 - 8) - (uVar6 - 1 & 0xfffffff8);
          a->num_bits = iVar15;
          if (iVar15 != 0) {
LAB_0015ed47:
            __assert_fail("a->num_bits == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                          ,0x1035,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
          }
          if (uVar20 < 3) goto LAB_0015ec13;
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) {
          stbi__g_failure_reason = "zlib corrupt";
          return 0;
        }
        psVar21 = a->zbuffer;
        uVar27 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar21 + uVar27) {
          stbi__g_failure_reason = "read past buffer";
          return 0;
        }
        pcVar23 = a->zout;
        if (a->zout_end < pcVar23 + uVar27) {
          iVar15 = stbi__zexpand(a,pcVar23,(uint)local_814.fast[0]);
          if (iVar15 == 0) {
            return 0;
          }
          psVar21 = a->zbuffer;
          pcVar23 = a->zout;
        }
        memcpy(pcVar23,psVar21,uVar27);
        a->zbuffer = a->zbuffer + uVar27;
        a->zout = a->zout + uVar27;
        goto LAB_0015ecb3;
      case 1:
        iVar15 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar15 == 0) {
          return 0;
        }
        psVar21 = 
        "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
        ;
        iVar15 = 0x20;
        break;
      case 2:
        if (iVar7 < 7) {
          stbi__fill_bits(a);
          uVar6 = a->num_bits;
          sVar25 = a->code_buffer;
        }
        uVar17 = sVar25 >> 5;
        iVar15 = uVar6 - 5;
        a->code_buffer = uVar17;
        a->num_bits = iVar15;
        if ((int)uVar6 < 10) {
          stbi__fill_bits(a);
          iVar15 = a->num_bits;
          uVar17 = a->code_buffer;
        }
        uVar6 = uVar17 >> 5;
        iVar7 = iVar15 + -5;
        a->code_buffer = uVar6;
        a->num_bits = iVar7;
        if (iVar15 < 9) {
          stbi__fill_bits(a);
          iVar7 = a->num_bits;
          uVar6 = a->code_buffer;
        }
        uVar13 = uVar6 >> 4;
        iVar7 = iVar7 + -4;
        uVar27 = 0;
        uVar26 = (sVar25 & 0x1f) + 0x101;
        iVar15 = (uVar17 & 0x1f) + 1;
        a->code_buffer = uVar13;
        a->num_bits = iVar7;
        local_a08 = SUB1615((undefined1  [16])0x0,0);
        uStack_9f9 = 0;
        do {
          uVar17 = uVar13;
          if (iVar7 < 3) {
            stbi__fill_bits(a);
            iVar7 = a->num_bits;
            uVar17 = a->code_buffer;
          }
          uVar13 = uVar17 >> 3;
          iVar7 = iVar7 + -3;
          a->code_buffer = uVar13;
          a->num_bits = iVar7;
          pbVar16 = &stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag + uVar27;
          uVar27 = uVar27 + 1;
          local_a08[*pbVar16] = (byte)uVar17 & 7;
        } while ((uVar6 & 0xf) + 4 != uVar27);
        iVar7 = stbi__zbuild_huffman(&local_814,local_a08,0x13);
        if (iVar7 == 0) {
          return 0;
        }
        iVar7 = a->num_bits;
        iVar8 = iVar15 + uVar26;
        iVar18 = 0;
        do {
          if (iVar7 < 0x10) {
            stbi__fill_bits(a);
          }
          uVar6 = a->code_buffer;
          uVar11 = local_814.fast[uVar6 & 0x1ff];
          if (uVar11 == 0) {
            auVar28._8_8_ = 0x8040201008040201;
            auVar28._0_8_ = 0x8040201008040201;
            auVar28 = vgf2p8affineqb_avx512vl(ZEXT416(uVar6),auVar28,0);
            uVar11 = auVar28._0_2_ << 8 | auVar28._0_2_ >> 8;
            lVar9 = 0;
            do {
              lVar14 = lVar9;
              lVar9 = lVar14 + 1;
            } while (local_814.maxcode[lVar14 + 10] <= (int)(uint)uVar11);
            if (lVar9 == 7) goto LAB_0015ecc9;
            lVar22 = (ulong)local_814.firstsymbol[lVar14 + 10] +
                     ((ulong)(uVar11 >> ((byte)(7 - (char)lVar9) & 0x1f)) -
                     (ulong)local_814.firstcode[lVar14 + 10]);
            if ((ulong)*(byte *)((long)&local_814 + lVar22 + 0x484) - 9 != lVar9) goto LAB_0015ed28;
            uVar6 = uVar6 >> ((int)lVar14 + 10U & 0x1f);
            a->code_buffer = uVar6;
            iVar7 = (a->num_bits - (int)lVar9) + -9;
            a->num_bits = iVar7;
            uVar12 = *(ushort *)((long)&local_814 + lVar22 * 2 + 0x5a4);
          }
          else {
            uVar12 = uVar11 & 0x1ff;
            uVar6 = uVar6 >> (uVar11 >> 9 & 0x1f);
            a->code_buffer = uVar6;
            iVar7 = a->num_bits - (uint)(uVar11 >> 9);
            a->num_bits = iVar7;
          }
          if (0x12 < uVar12) goto LAB_0015ecc9;
          if (uVar12 < 0x10) {
            lVar9 = (long)iVar18;
            iVar18 = iVar18 + 1;
            local_9e8[lVar9] = (char)uVar12;
          }
          else {
            if (uVar12 == 0x11) {
              if (iVar7 < 3) {
                stbi__fill_bits(a);
                iVar7 = a->num_bits;
                uVar6 = a->code_buffer;
              }
              iVar7 = iVar7 + -3;
              a->code_buffer = uVar6 >> 3;
              a->num_bits = iVar7;
              uVar17 = (uVar6 & 7) + 3;
LAB_0015e89d:
              bVar10 = 0;
            }
            else {
              if (uVar12 != 0x10) {
                if (iVar7 < 7) {
                  stbi__fill_bits(a);
                  iVar7 = a->num_bits;
                  uVar6 = a->code_buffer;
                }
                iVar7 = iVar7 + -7;
                uVar17 = (uVar6 & 0x7f) + 0xb;
                a->code_buffer = uVar6 >> 7;
                a->num_bits = iVar7;
                goto LAB_0015e89d;
              }
              if (iVar7 < 2) {
                stbi__fill_bits(a);
                iVar7 = a->num_bits;
                uVar6 = a->code_buffer;
              }
              iVar7 = iVar7 + -2;
              a->code_buffer = uVar6 >> 2;
              a->num_bits = iVar7;
              if (iVar18 == 0) goto LAB_0015ecc9;
              bVar10 = (&bStack_9e9)[iVar18];
              uVar17 = (uVar6 & 3) + 3;
            }
            if (iVar8 - iVar18 < (int)uVar17) goto LAB_0015ecc9;
            memset(local_9e8 + iVar18,(uint)bVar10,(ulong)uVar17);
            iVar18 = iVar18 + uVar17;
          }
        } while (iVar18 < iVar8);
        if (iVar18 != iVar8) {
LAB_0015ecc9:
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar7 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar26);
        if (iVar7 == 0) {
          return 0;
        }
        psVar21 = local_9e8 + uVar26;
        break;
      case 3:
        goto switchD_0015e552_caseD_3;
      }
      iVar15 = stbi__zbuild_huffman(&a->z_distance,psVar21,iVar15);
      if (iVar15 == 0) {
        return 0;
      }
      pcVar23 = a->zout;
      while( true ) {
        while( true ) {
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar6 = a->code_buffer;
          uVar11 = (a->z_length).fast[uVar6 & 0x1ff];
          if (uVar11 == 0) {
            auVar5._8_8_ = 0x8040201008040201;
            auVar5._0_8_ = 0x8040201008040201;
            auVar28 = vgf2p8affineqb_avx512vl(ZEXT416(uVar6),auVar5,0);
            uVar11 = auVar28._0_2_ << 8 | auVar28._0_2_ >> 8;
            lVar9 = 0;
            do {
              lVar14 = lVar9;
              lVar9 = lVar14 + 1;
            } while ((a->z_length).maxcode[lVar14 + 10] <= (int)(uint)uVar11);
            if (lVar9 == 7) goto LAB_0015ecdb;
            lVar22 = (ulong)(a->z_length).firstsymbol[lVar14 + 10] +
                     ((ulong)(uVar11 >> ((byte)(7 - (char)lVar9) & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar14 + 10]);
            if ((ulong)*(byte *)((long)a + lVar22 + 0x4b8) - 9 != lVar9) goto LAB_0015ed28;
            uVar6 = uVar6 >> ((int)lVar14 + 10U & 0x1f);
            a->code_buffer = uVar6;
            iVar15 = (a->num_bits - (int)lVar9) + -9;
            a->num_bits = iVar15;
            uVar17 = (uint)*(ushort *)((long)a + lVar22 * 2 + 0x5d8);
          }
          else {
            uVar17 = uVar11 & 0x1ff;
            uVar6 = uVar6 >> (uVar11 >> 9 & 0x1f);
            a->code_buffer = uVar6;
            iVar15 = a->num_bits - (uint)(uVar11 >> 9);
            a->num_bits = iVar15;
          }
          if (0xff < uVar17) break;
          if (a->zout_end <= pcVar23) {
            iVar15 = stbi__zexpand(a,pcVar23,1);
            if (iVar15 == 0) {
              return 0;
            }
            pcVar23 = a->zout;
          }
          *pcVar23 = (char)uVar17;
          pcVar23 = pcVar23 + 1;
        }
        if (uVar17 == 0x100) break;
        uVar27 = (ulong)(uVar17 - 0x101);
        uVar17 = stbi__zlength_base[uVar27];
        if (0xffffffffffffffeb < uVar27 - 0x1c) {
          uVar13 = stbi__zlength_extra[uVar27];
          if (iVar15 < (int)uVar13) {
            stbi__fill_bits(a);
            iVar15 = a->num_bits;
            uVar6 = a->code_buffer;
          }
          sVar3 = ((byte)uVar13 < 0x21) * (' ' - (byte)uVar13);
          uVar26 = uVar6 << sVar3;
          uVar6 = uVar6 >> (uVar13 & 0x1f);
          iVar15 = iVar15 - uVar13;
          uVar17 = uVar17 + (uVar26 >> sVar3);
          a->code_buffer = uVar6;
          a->num_bits = iVar15;
        }
        if (iVar15 < 0x10) {
          stbi__fill_bits(a);
          uVar6 = a->code_buffer;
        }
        uVar11 = (a->z_distance).fast[uVar6 & 0x1ff];
        if (uVar11 == 0) {
          auVar4._8_8_ = 0x8040201008040201;
          auVar4._0_8_ = 0x8040201008040201;
          auVar28 = vgf2p8affineqb_avx512vl(ZEXT416(uVar6),auVar4,0);
          uVar11 = auVar28._0_2_ << 8 | auVar28._0_2_ >> 8;
          lVar9 = 0;
          do {
            lVar14 = lVar9;
            lVar9 = lVar14 + 1;
          } while ((a->z_distance).maxcode[lVar14 + 10] <= (int)(uint)uVar11);
          if (lVar9 == 7) {
LAB_0015ecdb:
            stbi__g_failure_reason = "bad huffman code";
            return 0;
          }
          lVar22 = (ulong)(a->z_distance).firstsymbol[lVar14 + 10] +
                   ((ulong)(uVar11 >> ((byte)(7 - (char)lVar9) & 0x1f)) -
                   (ulong)(a->z_distance).firstcode[lVar14 + 10]);
          if ((ulong)*(byte *)((long)a + lVar22 + 0xc9c) - 9 != lVar9) {
LAB_0015ed28:
            __assert_fail("z->size[b] == s",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/fjzzq2002[P]MiniShader/stb_image.h"
                          ,0xf98,
                          "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
          }
          uVar6 = uVar6 >> ((int)lVar14 + 10U & 0x1f);
          a->code_buffer = uVar6;
          iVar15 = (a->num_bits - (int)lVar9) + -9;
          a->num_bits = iVar15;
          uVar13 = (uint)*(ushort *)((long)a + lVar22 * 2 + 0xdbc);
        }
        else {
          uVar13 = uVar11 & 0x1ff;
          uVar6 = uVar6 >> (uVar11 >> 9 & 0x1f);
          a->code_buffer = uVar6;
          iVar15 = a->num_bits - (uint)(uVar11 >> 9);
          a->num_bits = iVar15;
        }
        uVar27 = (ulong)uVar13;
        iVar7 = stbi__zdist_base[uVar27];
        if (0xffffffffffffffe5 < uVar27 - 0x1e) {
          uVar13 = stbi__zdist_extra[uVar27];
          if (iVar15 < (int)uVar13) {
            stbi__fill_bits(a);
            iVar15 = a->num_bits;
            uVar6 = a->code_buffer;
          }
          sVar3 = ((byte)uVar13 < 0x21) * (' ' - (byte)uVar13);
          iVar7 = iVar7 + ((uVar6 << sVar3) >> sVar3);
          a->code_buffer = uVar6 >> (uVar13 & 0x1f);
          a->num_bits = iVar15 - uVar13;
        }
        if ((long)pcVar23 - (long)a->zout_start < (long)iVar7) {
          stbi__g_failure_reason = "bad dist";
          return 0;
        }
        if (a->zout_end < pcVar23 + (int)uVar17) {
          iVar15 = stbi__zexpand(a,pcVar23,uVar17);
          if (iVar15 == 0) {
            return 0;
          }
          pcVar23 = a->zout;
        }
        lVar9 = -(long)iVar7;
        if (iVar7 == 1) {
          if (uVar17 != 0) {
            memset(pcVar23,(uint)(byte)pcVar23[lVar9],(ulong)uVar17);
            pcVar23 = pcVar23 + (ulong)(uVar17 - 1) + 1;
          }
        }
        else {
          for (; uVar17 != 0; uVar17 = uVar17 - 1) {
            *pcVar23 = pcVar23[lVar9];
            pcVar23 = pcVar23 + 1;
          }
        }
      }
      a->zout = pcVar23;
LAB_0015ecb3:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar15 = a->num_bits;
    } while( true );
  }
  pbVar16 = a->zbuffer;
  uVar11 = 0;
  if (pbVar16 < a->zbuffer_end) {
    a->zbuffer = pbVar16 + 1;
    bVar10 = *pbVar16;
    pbVar16 = pbVar16 + 1;
  }
  else {
    bVar10 = 0;
  }
  if (pbVar16 < a->zbuffer_end) {
    a->zbuffer = pbVar16 + 1;
    uVar11 = (ushort)*pbVar16;
  }
  if ((ushort)(((ushort)bVar10 << 8 | uVar11) * 0x7bdf) < 0x843) {
    if ((uVar11 & 0x20) == 0) {
      if ((bVar10 & 0xf) == 8) goto LAB_0015e4d0;
      stbi__g_failure_reason = "bad compression";
    }
    else {
      stbi__g_failure_reason = "no preset dict";
    }
  }
  else {
    stbi__g_failure_reason = "bad zlib header";
  }
switchD_0015e552_caseD_3:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}